

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skin.cpp
# Opt level: O2

void * rw::skinOpen(void *o,int32 param_2,int32 param_3)

{
  ObjPipeline *pOVar1;
  long lVar2;
  
  pOVar1 = ObjPipeline::create();
  _DAT_001452e0 = pOVar1;
  (pOVar1->super_Pipeline).pluginID = 0x116;
  (pOVar1->super_Pipeline).pluginData = 1;
  for (lVar2 = 1; lVar2 != 0xe; lVar2 = lVar2 + 1) {
    *(ObjPipeline **)(&skinGlobals + lVar2 * 2) = pOVar1;
  }
  return o;
}

Assistant:

static void*
skinOpen(void *o, int32, int32)
{
	// init dummy pipelines
	skinGlobals.dummypipe = ObjPipeline::create();
	skinGlobals.dummypipe->pluginID = ID_SKIN;
	skinGlobals.dummypipe->pluginData = 1;
	for(uint i = 0; i < nelem(skinGlobals.pipelines); i++)
		skinGlobals.pipelines[i] = skinGlobals.dummypipe;
	return o;
}